

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O2

void __thiscall OpenMD::MoleculeStamp::checkBonds(MoleculeStamp *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  pointer piVar4;
  int __tmp;
  ostream *poVar5;
  OpenMDException *pOVar6;
  pointer ppBVar7;
  iterator iVar8;
  pointer ppBVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  pair<int,_int> bondPair;
  string local_1f8;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  allBonds;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  ppBVar7 = (this->bondStamps_).
            super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppBVar9 = (this->bondStamps_).
            super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  lVar13 = ((long)ppBVar9 - (long)ppBVar7 >> 3) + 1;
  lVar14 = 0;
  do {
    lVar13 = lVar13 + -1;
    if (lVar13 == 0) {
      allBonds._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &allBonds._M_t._M_impl.super__Rb_tree_header._M_header;
      allBonds._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      allBonds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      allBonds._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      lVar13 = 0;
      uVar12 = 0;
      allBonds._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           allBonds._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        uVar10 = (long)ppBVar9 - (long)ppBVar7 >> 3;
        if (uVar10 <= uVar12) {
          piVar4 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar14 = uVar10 + 1;
          lVar13 = 0;
          do {
            lVar14 = lVar14 + -1;
            if (lVar14 == 0) {
              std::
              _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
              ::~_Rb_tree(&allBonds._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
              return;
            }
            lVar3 = *(long *)((long)ppBVar7 + (lVar13 >> 0x1d));
            lVar13 = lVar13 + 0x100000000;
          } while (piVar4[*(int *)(lVar3 + 0xa0)] != piVar4[*(int *)(lVar3 + 0xa4)]);
          poVar5 = std::operator<<((ostream *)&oss,"Error in Molecule ");
          std::__cxx11::string::string((string *)&local_1f8,(string *)&(this->Name).data_);
          poVar5 = std::operator<<(poVar5,(string *)&local_1f8);
          poVar5 = std::operator<<(poVar5,": ");
          poVar5 = std::operator<<(poVar5,"bond(");
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,*(int *)(lVar3 + 0xa0));
          poVar5 = std::operator<<(poVar5,", ");
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,*(int *)(lVar3 + 0xa4));
          poVar5 = std::operator<<(poVar5,") belong to same rigidbody ");
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)poVar5,
                              (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[*(int *)(lVar3 + 0xa0)]);
          std::operator<<(poVar5,"\n");
          std::__cxx11::string::~string((string *)&local_1f8);
          pOVar6 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar6,&local_1f8);
          __cxa_throw(pOVar6,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        lVar14 = *(long *)((long)ppBVar7 + (lVar13 >> 0x1d));
        iVar1 = *(int *)(lVar14 + 0xa0);
        bondPair.second = *(int *)(lVar14 + 0xa4);
        bondPair.first = iVar1;
        if (bondPair.second < iVar1) {
          bondPair.first = bondPair.second;
          bondPair.second = iVar1;
        }
        iVar8 = std::
                _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                ::find((_Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                        *)&allBonds,&bondPair);
        if ((_Rb_tree_header *)iVar8._M_node != &allBonds._M_t._M_impl.super__Rb_tree_header) break;
        std::
        _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
        ::_M_insert_unique<std::pair<int,int>const&>
                  ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                    *)&allBonds,&bondPair);
        uVar12 = uVar12 + 1;
        ppBVar7 = (this->bondStamps_).
                  super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppBVar9 = (this->bondStamps_).
                  super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        lVar13 = lVar13 + 0x100000000;
      }
      poVar5 = std::operator<<((ostream *)&oss,"Error in Molecule ");
      std::__cxx11::string::string((string *)&local_1f8,(string *)&(this->Name).data_);
      poVar5 = std::operator<<(poVar5,(string *)&local_1f8);
      poVar5 = std::operator<<(poVar5,": ");
      poVar5 = std::operator<<(poVar5,"bond(");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar8._M_node[1]._M_color);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = (ostream *)
               std::ostream::operator<<((ostream *)poVar5,*(int *)&iVar8._M_node[1].field_0x4);
      std::operator<<(poVar5,") appears multiple times\n");
      std::__cxx11::string::~string((string *)&local_1f8);
      pOVar6 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      OpenMDException::OpenMDException(pOVar6,&local_1f8);
      __cxa_throw(pOVar6,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    lVar3 = *(long *)((long)ppBVar7 + (lVar14 >> 0x1d));
    iVar1 = *(int *)(lVar3 + 0xa0);
    iVar11 = (int)((ulong)((long)(this->atomStamps_).
                                 super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->atomStamps_).
                                super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
  } while ((((iVar1 < iVar11) && (-1 < iVar1)) && (iVar2 = *(int *)(lVar3 + 0xa4), iVar1 != iVar2))
          && ((iVar2 < iVar11 && (lVar14 = lVar14 + 0x100000000, -1 < iVar2))));
  poVar5 = std::operator<<((ostream *)&oss,"Error in Molecule ");
  std::__cxx11::string::string((string *)&allBonds,(string *)&(this->Name).data_);
  poVar5 = std::operator<<(poVar5,(string *)&allBonds);
  poVar5 = std::operator<<(poVar5,": bond(");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,*(int *)(lVar3 + 0xa0));
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,*(int *)(lVar3 + 0xa4));
  std::operator<<(poVar5,") is invalid\n");
  std::__cxx11::string::~string((string *)&allBonds);
  pOVar6 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(pOVar6,(string *)&allBonds);
  __cxa_throw(pOVar6,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void MoleculeStamp::checkBonds() {
    std::ostringstream oss;
    // make sure index is not out of range
    int natoms = static_cast<int>(getNAtoms());
    for (std::size_t i = 0; i < getNBonds(); ++i) {
      BondStamp* bondStamp = getBondStamp(i);
      if (bondStamp->getA() > natoms - 1 || bondStamp->getA() < 0 ||
          bondStamp->getB() > natoms - 1 || bondStamp->getB() < 0 ||
          bondStamp->getA() == bondStamp->getB()) {
        oss << "Error in Molecule " << getName() << ": bond("
            << bondStamp->getA() << ", " << bondStamp->getB()
            << ") is invalid\n";
        throw OpenMDException(oss.str());
      }
    }

    // make sure bonds are unique
    std::set<std::pair<int, int>> allBonds;
    for (std::size_t i = 0; i < getNBonds(); ++i) {
      BondStamp* bondStamp = getBondStamp(i);
      std::pair<int, int> bondPair(bondStamp->getA(), bondStamp->getB());
      // make sure bondPair.first is always less than or equal to
      // bondPair.third
      if (bondPair.first > bondPair.second) {
        std::swap(bondPair.first, bondPair.second);
      }

      std::set<std::pair<int, int>>::iterator iter = allBonds.find(bondPair);
      if (iter != allBonds.end()) {
        oss << "Error in Molecule " << getName() << ": "
            << "bond(" << iter->first << ", " << iter->second
            << ") appears multiple times\n";
        throw OpenMDException(oss.str());
      } else {
        allBonds.insert(bondPair);
      }
    }

    // make sure atoms belong to same rigidbody do not bond to each other
    for (std::size_t i = 0; i < getNBonds(); ++i) {
      BondStamp* bondStamp = getBondStamp(i);
      if (atom2Rigidbody[bondStamp->getA()] ==
          atom2Rigidbody[bondStamp->getB()]) {
        oss << "Error in Molecule " << getName() << ": "
            << "bond(" << bondStamp->getA() << ", " << bondStamp->getB()
            << ") belong to same rigidbody "
            << atom2Rigidbody[bondStamp->getA()] << "\n";
        throw OpenMDException(oss.str());
      }
    }
  }